

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Exporter.cpp
# Opt level: O1

aiExportDataBlob * __thiscall
Assimp::Exporter::ExportToBlob
          (Exporter *this,aiScene *pScene,char *pFormatId,uint pPreprocessing,
          ExportProperties *pProperties)

{
  element_type *peVar1;
  ExporterPimpl *pEVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  BlobIOSystem *pBVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  aiReturn aVar5;
  BlobIOSystem *__p;
  aiExportDataBlob *paVar6;
  _Rb_tree_header *p_Var7;
  shared_ptr<Assimp::IOSystem> old;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50;
  BlobIOSystem *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_40 [2];
  
  paVar6 = this->pimpl->blob;
  if (paVar6 != (aiExportDataBlob *)0x0) {
    aiExportDataBlob::~aiExportDataBlob(paVar6);
    operator_delete(paVar6);
    this->pimpl->blob = (aiExportDataBlob *)0x0;
  }
  peVar1 = (this->pimpl->mIOSystem).super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  local_50._M_pi =
       (this->pimpl->mIOSystem).super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_50._M_pi)->_M_use_count = (local_50._M_pi)->_M_use_count + 1;
    }
  }
  __p = (BlobIOSystem *)Intern::AllocateFromAssimpHeap::operator_new(0x68);
  (__p->super_IOSystem).m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->super_IOSystem).m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->super_IOSystem).m_pathStack.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->super_IOSystem)._vptr_IOSystem = (_func_int **)&PTR__BlobIOSystem_0081cfc8;
  p_Var7 = &(__p->created)._M_t._M_impl.super__Rb_tree_header;
  (__p->created)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__p->created)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__p->created)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var7->_M_header;
  (__p->created)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var7->_M_header;
  (__p->created)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (__p->blobs).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->blobs).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->blobs).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_aiExportDataBlob_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Assimp::BlobIOSystem*>
            (a_Stack_40,__p);
  _Var4._M_pi = a_Stack_40[0]._M_pi;
  pBVar3 = local_48;
  pEVar2 = this->pimpl;
  local_48 = (BlobIOSystem *)0x0;
  a_Stack_40[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (pEVar2->mIOSystem).super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (pEVar2->mIOSystem).super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &pBVar3->super_IOSystem;
  (pEVar2->mIOSystem).super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var4._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if (a_Stack_40[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_40[0]._M_pi);
  }
  aVar5 = Export(this,pScene,pFormatId,"$blobfile",pPreprocessing,pProperties);
  if (aVar5 == aiReturn_SUCCESS) {
    paVar6 = BlobIOSystem::GetBlobChain(__p);
    this->pimpl->blob = paVar6;
    pEVar2 = this->pimpl;
    (pEVar2->mIOSystem).super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pEVar2->mIOSystem).super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,&local_50);
    paVar6 = this->pimpl->blob;
  }
  else {
    pEVar2 = this->pimpl;
    (pEVar2->mIOSystem).super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         peVar1;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pEVar2->mIOSystem).super___shared_ptr<Assimp::IOSystem,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,&local_50);
    paVar6 = (aiExportDataBlob *)0x0;
  }
  if (local_50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50._M_pi);
  }
  return paVar6;
}

Assistant:

const aiExportDataBlob* Exporter::ExportToBlob( const aiScene* pScene, const char* pFormatId,
                                                unsigned int pPreprocessing, const ExportProperties* pProperties) {
    if (pimpl->blob) {
        delete pimpl->blob;
        pimpl->blob = nullptr;
    }

    std::shared_ptr<IOSystem> old = pimpl->mIOSystem;
    BlobIOSystem* blobio = new BlobIOSystem();
    pimpl->mIOSystem = std::shared_ptr<IOSystem>( blobio );

    if (AI_SUCCESS != Export(pScene,pFormatId,blobio->GetMagicFileName(), pPreprocessing, pProperties)) {
        pimpl->mIOSystem = old;
        return nullptr;
    }

    pimpl->blob = blobio->GetBlobChain();
    pimpl->mIOSystem = old;

    return pimpl->blob;
}